

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_filter.cpp
# Opt level: O1

bool __thiscall duckdb::ConstantFilter::Compare(ConstantFilter *this,Value *value)

{
  bool bVar1;
  InternalException *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch((this->super_TableFilter).field_0x9) {
  case 0x19:
    bVar1 = ValueOperations::Equals(value,&this->constant);
    return bVar1;
  case 0x1a:
    bVar1 = ValueOperations::NotEquals(value,&this->constant);
    return bVar1;
  case 0x1b:
    bVar1 = ValueOperations::LessThan(value,&this->constant);
    return bVar1;
  case 0x1c:
    bVar1 = ValueOperations::GreaterThan(value,&this->constant);
    return bVar1;
  case 0x1d:
    bVar1 = ValueOperations::LessThanEquals(value,&this->constant);
    return bVar1;
  case 0x1e:
    bVar1 = ValueOperations::GreaterThanEquals(value,&this->constant);
    return bVar1;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    EnumUtil::ToString<duckdb::ExpressionType>(&sStack_58,(this->super_TableFilter).field_0x9);
    ::std::operator+(&local_38,"unknown comparison type for ConstantFilter: ",&sStack_58);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

bool ConstantFilter::Compare(const Value &value) const {
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
		return ValueOperations::Equals(value, constant);
	case ExpressionType::COMPARE_NOTEQUAL:
		return ValueOperations::NotEquals(value, constant);
	case ExpressionType::COMPARE_GREATERTHAN:
		return ValueOperations::GreaterThan(value, constant);
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return ValueOperations::GreaterThanEquals(value, constant);
	case ExpressionType::COMPARE_LESSTHAN:
		return ValueOperations::LessThan(value, constant);
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return ValueOperations::LessThanEquals(value, constant);
	default:
		throw InternalException("unknown comparison type for ConstantFilter: " + EnumUtil::ToString(comparison_type));
	}
}